

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCOBBTree.cpp
# Opt level: O1

int __thiscall chrono::collision::CHOBBTree::ResetModel(CHOBBTree *this)

{
  pointer pCVar1;
  pointer pCVar2;
  pointer this_00;
  
  ChCollisionTree::ResetModel(&this->super_ChCollisionTree);
  pCVar1 = (this->b).
           super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (this->b).
           super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  this_00 = pCVar1;
  if (pCVar2 != pCVar1) {
    do {
      CHOBB::~CHOBB(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pCVar2);
    (this->b).
    super__Vector_base<chrono::collision::CHOBB,_std::allocator<chrono::collision::CHOBB>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar1;
  }
  this->current_box = 0;
  return 0;
}

Assistant:

int CHOBBTree::ResetModel() {
    // INHERIT PARENT CLASS RESET FUNCTION
    ChCollisionTree::ResetModel();

    b.clear();

    current_box = 0;

    return ChC_OK;
}